

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartialUnion.cpp
# Opt level: O0

void __thiscall dgrminer::PartialUnion::printEncoding(PartialUnion *this)

{
  bool bVar1;
  ostream *poVar2;
  pointer ppVar3;
  pointer ppVar4;
  _Rb_tree_iterator<std::pair<const_int,_int>_> local_30;
  _Self local_28;
  _Base_ptr local_20;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  local_18;
  iterator i;
  PartialUnion *this_local;
  
  i._M_node = (_Base_ptr)this;
  poVar2 = std::operator<<((ostream *)&std::cout,"LABELING:");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  ::_Rb_tree_iterator(&local_18);
  local_20 = (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::begin(&this->labelEncoding);
  local_18._M_node = local_20;
  while( true ) {
    local_28._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
         ::end(&this->labelEncoding);
    bVar1 = std::operator!=(&local_18,&local_28);
    if (!bVar1) break;
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
             ::operator->(&local_18);
    poVar2 = std::operator<<((ostream *)&std::cout,(string *)ppVar3);
    poVar2 = std::operator<<(poVar2," ");
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
             ::operator->(&local_18);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,ppVar3->second);
    poVar2 = std::operator<<(poVar2," (OLD: ");
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
             ::operator->(&local_18);
    local_30._M_node =
         (_Base_ptr)
         std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::find
                   (&this->antecedentLabelsOfLabels,&ppVar3->second);
    ppVar4 = std::_Rb_tree_iterator<std::pair<const_int,_int>_>::operator->(&local_30);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,ppVar4->second);
    poVar2 = std::operator<<(poVar2,")");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
    ::operator++(&local_18,0);
  }
  return;
}

Assistant:

void PartialUnion::printEncoding()
	{
		cout << "LABELING:" << endl;
		std::map<std::string, int>::iterator i;
		for (i = labelEncoding.begin(); i != labelEncoding.end(); i++)
		{
			std::cout << i->first << " " << i->second << " (OLD: " << antecedentLabelsOfLabels.find(i->second)->second << ")" << std::endl;
		}
	}